

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

bool __thiscall
dap::BasicTypeInfo<dap::optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_>_>::
serialize(BasicTypeInfo<dap::optional<std::vector<dap::Source,_std::allocator<dap::Source>_>_>_>
          *this,Serializer *s,void *ptr)

{
  undefined1 uVar1;
  const_iterator it;
  long *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  long local_10;
  int iVar2;
  
  if (*(char *)((long)ptr + 0x18) == '\0') {
    (*s->_vptr_Serializer[10])();
    uVar1 = 1;
  }
  else {
    local_10 = *ptr;
    local_30 = &local_10;
    local_28 = 0;
    local_18 = std::
               _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:200:28)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:200:28)>
               ::_M_manager;
    iVar2 = (*s->_vptr_Serializer[8])
                      (s,(*(long *)((long)ptr + 8) - local_10 >> 4) * -0x79435e50d79435e5);
    uVar1 = (undefined1)iVar2;
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,3);
    }
  }
  return (bool)uVar1;
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }